

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_qwen::llm_build_qwen
          (llm_build_qwen *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  const_reference pvVar6;
  ggml_tensor *kq_b;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_tensor *name;
  ggml_cgraph *pgVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *pgVar15;
  pointer plVar16;
  ggml_tensor *in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffda8;
  int iVar17;
  llm_graph_context *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdb8;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffdc8;
  undefined4 uVar18;
  ggml_tensor *cur_01;
  llm_graph_context *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe60;
  ggml_tensor *in_stack_fffffffffffffe68;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *down_s;
  ggml_tensor *act_scales;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  int il_00;
  ggml_tensor *in_stack_fffffffffffffeb8;
  llm_graph_context *in_stack_fffffffffffffec0;
  ggml_tensor *in_stack_ffffffffffffff70;
  float kq_scale;
  ggml_tensor *in_stack_ffffffffffffff78;
  ggml_cgraph *gf_00;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar19;
  ggml_tensor *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffdc0,
             (llm_graph_params *)in_stack_fffffffffffffdb8);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1858,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  pgVar2 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  pgVar3 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffe10);
  pgVar4 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe50);
  for (iVar19 = 0; kq_scale = (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
      iVar17 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
      (long)iVar19 < *(long *)(in_RDI + 0x28); iVar19 = iVar19 + 1) {
    pgVar15 = pgVar2;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    llm_graph_context::build_norm
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8,(llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
               (int)in_stack_fffffffffffffdb0);
    uVar18 = (undefined4)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    pgVar5 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar17);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    kq_b = (ggml_tensor *)ggml_add(uVar10,pgVar5,pvVar6->bqkv);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar17);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar7 = ggml_view_2d(uVar10,kq_b,*(undefined8 *)(in_RDI + 0x20),(long)*(int *)(in_RDI + 0xa8),
                         kq_b->nb[1],0);
    uVar7 = ggml_cont(uVar10,uVar7);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar8 = ggml_view_2d();
    uVar8 = ggml_cont(uVar10,uVar8);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar9 = ggml_view_2d();
    uVar10 = ggml_cont(uVar10,uVar9);
    uVar7 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar7,uVar1,
                            *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar8 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar8,uVar1,
                            *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    name = (ggml_tensor *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar10,uVar1,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    pgVar11 = (ggml_cgraph *)
              ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                            *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                            *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                            *(undefined8 *)(in_RDI + 0xc0),uVar7,pgVar3,0,
                            *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    pgVar12 = (ggml_tensor *)
              ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                            *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                            *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                            *(undefined8 *)(in_RDI + 0xc0),uVar8,pgVar3,0,
                            *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar17);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar17);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar17);
    act_scales = pgVar4;
    pgVar5 = in_RCX;
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    type_op = (llm_ffn_op_type)pgVar5;
    type_gate = (llm_ffn_gate_type)pvVar6->wo;
    pgVar13 = name;
    pgVar14 = pgVar12;
    gf_00 = pgVar11;
    sqrtf((float)uVar1);
    il_00 = (int)pgVar11;
    cur_01 = (ggml_tensor *)CONCAT44(uVar18,iVar19);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar5 = name;
    down_s = pgVar12;
    pgVar13 = llm_graph_context::build_attn
                        ((llm_graph_context *)CONCAT44(iVar19,in_stack_ffffffffffffffa0),
                         (llm_graph_input_attn_kv_unified *)pgVar2,gf_00,pgVar14,pgVar13,
                         in_stack_ffffffffffffff78,pgVar3,pgVar15,kq_b,in_stack_ffffffffffffffc8,
                         kq_scale,in_stack_ffffffffffffffd0);
    iVar17 = (int)((ulong)pgVar12 >> 0x20);
    if ((long)iVar19 == *(long *)(in_RDI + 0x28) + -1) {
      in_stack_fffffffffffffe70 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe00);
      in_stack_ffffffffffffff78 = in_stack_fffffffffffffe70;
      in_stack_fffffffffffffe68 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar13,in_stack_fffffffffffffe70);
      pgVar13 = in_stack_fffffffffffffe68;
      in_stack_fffffffffffffe60 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar2,in_stack_ffffffffffffff78);
      pgVar2 = in_stack_fffffffffffffe60;
    }
    pgVar14 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar13,pgVar2);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar17);
    in_stack_ffffffffffffff70 = pgVar14;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    pgVar15 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffdd0,cur_01,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar17);
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar2 = pvVar6->ffn_up;
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar13 = pvVar6->ffn_gate;
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    in_stack_fffffffffffffdb8 = pvVar6->ffn_down;
    in_stack_fffffffffffffdd0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdc8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdc0 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdb0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffda8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe40 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)pgVar15,pgVar14,in_stack_fffffffffffffe40,
                    (ggml_tensor *)&stack0xfffffffffffffda8,pgVar13,pgVar2,in_stack_fffffffffffffe60
                    ,in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,pgVar5,down_s,act_scales,
                    type_op,type_gate,il_00);
    pgVar2 = in_stack_fffffffffffffe40;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar2,in_stack_ffffffffffffff70);
    in_stack_fffffffffffffe10 =
         llm_graph_context::build_cvec(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
    pgVar2 = in_stack_fffffffffffffe10;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  }
  pgVar3 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                      in_stack_fffffffffffffdb8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                      (int)in_stack_fffffffffffffdb0);
  pgVar2 = pgVar3;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (char *)in_stack_fffffffffffffdb0,iVar17);
  plVar16 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4cbf25);
  plVar16->t_embd = pgVar2;
  pgVar3 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)in_stack_fffffffffffffe10,pgVar3,
                      in_stack_fffffffffffffe00);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (char *)in_stack_fffffffffffffdb0,iVar17);
  pgVar2 = pgVar3;
  plVar16 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4cbfaa);
  plVar16->t_logits = pgVar3;
  ggml_build_forward_expand(in_RCX,pgVar2);
  return;
}

Assistant:

llm_build_qwen(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                cb(cur, "bqkv", il);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd, n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd, n_tokens, cur->nb[1], 2*sizeof(float)*(n_embd)));

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                // using mode = 2 for neox mode
                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward forward
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }